

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O2

void sysbvm_bytecodeJit_refSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tupleReference,sysbvm_tuple_t typeSlot,
               sysbvm_tuple_t value)

{
  size_t slotIndex;
  sysbvm_tuple_t tuple;
  
  slotIndex = sysbvm_typeSlot_getIndex(typeSlot);
  tuple = sysbvm_pointerLikeType_load(context,tupleReference);
  sysbvm_tuple_slotAtPut(context,tuple,slotIndex,value);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_refSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tupleReference, sysbvm_tuple_t typeSlot, sysbvm_tuple_t value)
{
    size_t slotIndex = sysbvm_typeSlot_getIndex(typeSlot);
    sysbvm_tuple_slotAtPut(context, sysbvm_pointerLikeType_load(context, tupleReference), slotIndex, value);
}